

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_random_unit.cpp
# Opt level: O1

Roaring64Map * make_random_bitset64(void)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint64_t uVar9;
  fd_set *__writefds;
  char *__filename;
  Roaring64Map *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  uint64_t element;
  uint64_t local_40;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *local_38;
  
  p_Var1 = &(in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(in_RDI->plain).copyOnWrite = 0;
  *(undefined8 *)&(in_RDI->plain).roarings._M_t._M_impl = 0;
  *(undefined8 *)&(in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (in_RDI->plain).roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (in_RDI->plain).copyOnWrite = false;
  p_Var1 = &(in_RDI->check)._M_t._M_impl.super__Rb_tree_header;
  (in_RDI->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (in_RDI->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (in_RDI->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->check)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->check)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar5 = rand();
  iVar5 = iVar5 % 100;
  if (0 < iVar5) {
    local_38 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&in_RDI->check;
    do {
      iVar6 = rand();
      uVar9 = gravity64;
      switch(iVar6 % 5) {
      case 0:
        local_40 = gravity64;
        roaring::Roaring64Map::add(&in_RDI->plain,gravity64);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>(local_38,&stack0xffffffffffffffc0);
        break;
      case 1:
        iVar6 = rand();
        iVar8 = rand();
        doublechecked::Roaring64Map::addRange
                  (in_RDI,(uVar9 + (long)(iVar6 % 0x32)) - 0x19,
                   ((long)(iVar8 % 100) + (long)(iVar6 % 0x32) + uVar9) - 0x19);
        break;
      case 2:
        iVar6 = rand();
        iVar8 = rand();
        doublechecked::Roaring64Map::removeRange
                  (in_RDI,(uVar9 + (long)(iVar6 % 10)) - 5,
                   ((long)(iVar8 % 5) + uVar9 + (long)(iVar6 % 10)) - 5);
        break;
      case 3:
        iVar6 = rand();
        iVar8 = rand();
        doublechecked::Roaring64Map::flip
                  (in_RDI,(uVar9 + (long)(iVar6 % 0x32)) - 0x19,
                   ((long)(iVar8 % 0x32) + uVar9 + (long)(iVar6 % 0x32)) - 0x19);
        break;
      case 4:
        uVar9 = roaring::Roaring64Map::cardinality(&in_RDI->plain);
        __writefds = (fd_set *)0x156;
        _assert_true((ulong)(uVar9 == (in_RDI->check)._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count),"ans == check.size()",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64map_checked.hh"
                     ,0x156);
        if (uVar9 != 0) {
          iVar6 = rand();
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar9;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (long)iVar6;
          __filename = SUB168(auVar3 % auVar2,0);
          local_40 = 0;
          uVar7 = doublechecked::Roaring64Map::select
                            (in_RDI,SUB164(auVar3 % auVar2,0),(fd_set *)&stack0xffffffffffffffc0,
                             __writefds,in_R8,in_R9);
          _assert_true((ulong)(uVar7 & 0xff),"r.select(rnk, &element)",
                       "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                       ,0x8a);
          uVar9 = doublechecked::Roaring64Map::rank(in_RDI,local_40);
          _assert_int_equal((unsigned_long)(__filename + 1),uVar9,
                            "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                            ,0x8b);
          doublechecked::Roaring64Map::remove(in_RDI,__filename);
        }
        break;
      default:
        _assert_true(0,"false",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
                     ,0x92);
      }
      iVar6 = rand();
      gravity64 = ((long)(iVar6 % 200) + gravity64) - 100;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  bVar4 = doublechecked::Roaring64Map::does_std_set_match_roaring(in_RDI);
  _assert_true((ulong)bVar4,"r.does_std_set_match_roaring()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_random_unit.cpp"
               ,0x96);
  return in_RDI;
}

Assistant:

Roaring64Map make_random_bitset64() {
    Roaring64Map r;
    int num_ops = rand() % 100;
    for (int i = 0; i < num_ops; ++i) {
        switch (rand() % 5) {
            case 0:
                r.add(gravity64);
                break;

            case 1: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.addRange(start, start + rand() % 100);
                break;
            }

            case 2: {
                uint64_t start = gravity64 + (rand() % 10) - 5;
                r.removeRange(start, start + rand() % 5);
                break;
            }

            case 3: {
                uint64_t start = gravity64 + (rand() % 50) - 25;
                r.flip(start, start + rand() % 50);
                break;
            }

            case 4: {  // tests remove(), select(), rank()
                uint64_t card = r.cardinality();
                if (card != 0) {
                    uint64_t rnk = rand() % card;
                    uint64_t element = 0;
                    assert_true(r.select(rnk, &element));
                    assert_int_equal(rnk + 1, r.rank(element));
                    r.remove(rnk);
                }
                break;
            }

            default:
                assert_true(false);
        }
        gravity64 += (rand() % 200) - 100;
    }
    assert_true(r.does_std_set_match_roaring());
    return r;
}